

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

bool absl::anon_unknown_0::MustRoundUp
               (uint64_t guess_mantissa,int guess_exponent,ParsedFloat *parsed_decimal)

{
  BigUnsigned<84> *this;
  int iVar1;
  uint64_t v;
  undefined1 local_434 [8];
  BigUnsigned<84> rhs_1;
  BigUnsigned<84> rhs;
  int comparison;
  BigUnsigned<84> *lhs;
  int exact_exponent;
  BigUnsigned<84> exact_mantissa;
  ParsedFloat *parsed_decimal_local;
  int guess_exponent_local;
  uint64_t guess_mantissa_local;
  
  exact_mantissa.words_._328_8_ = parsed_decimal;
  strings_internal::BigUnsigned<84>::BigUnsigned((BigUnsigned<84> *)((long)&lhs + 4));
  lhs._0_4_ = strings_internal::BigUnsigned<84>::ReadFloatMantissa
                        ((BigUnsigned<84> *)((long)&lhs + 4),
                         (ParsedFloat *)exact_mantissa.words_._328_8_,0x300);
  v = guess_mantissa * 2 + 1;
  iVar1 = guess_exponent + -1;
  this = (BigUnsigned<84> *)((long)&lhs + 4);
  if ((int)lhs < 0) {
    strings_internal::BigUnsigned<84>::FiveToTheNth((BigUnsigned<84> *)local_434,-(int)lhs);
    strings_internal::BigUnsigned<84>::MultiplyBy((BigUnsigned<84> *)local_434,v);
    if (iVar1 < (int)lhs) {
      strings_internal::BigUnsigned<84>::ShiftLeft(this,(int)lhs - iVar1);
    }
    else {
      strings_internal::BigUnsigned<84>::ShiftLeft((BigUnsigned<84> *)local_434,iVar1 - (int)lhs);
    }
    rhs.words_[0x52] = strings_internal::Compare<84,84>(this,(BigUnsigned<84> *)local_434);
  }
  else {
    strings_internal::BigUnsigned<84>::MultiplyByFiveToTheNth(this,(int)lhs);
    strings_internal::BigUnsigned<84>::BigUnsigned((BigUnsigned<84> *)(rhs_1.words_ + 0x52),v);
    if (iVar1 < (int)lhs) {
      strings_internal::BigUnsigned<84>::ShiftLeft(this,(int)lhs - iVar1);
    }
    else {
      strings_internal::BigUnsigned<84>::ShiftLeft
                ((BigUnsigned<84> *)(rhs_1.words_ + 0x52),iVar1 - (int)lhs);
    }
    rhs.words_[0x52] =
         strings_internal::Compare<84,84>(this,(BigUnsigned<84> *)(rhs_1.words_ + 0x52));
  }
  if ((int)rhs.words_[0x52] < 0) {
    guess_mantissa_local._7_1_ = false;
  }
  else if ((int)rhs.words_[0x52] < 1) {
    guess_mantissa_local._7_1_ = (v & 2) == 2;
  }
  else {
    guess_mantissa_local._7_1_ = true;
  }
  return guess_mantissa_local._7_1_;
}

Assistant:

bool MustRoundUp(uint64_t guess_mantissa, int guess_exponent,
                 const strings_internal::ParsedFloat& parsed_decimal) {
  // 768 is the number of digits needed in the worst case.  We could determine a
  // better limit dynamically based on the value of parsed_decimal.exponent.
  // This would optimize pathological input cases only.  (Sane inputs won't have
  // hundreds of digits of mantissa.)
  absl::strings_internal::BigUnsigned<84> exact_mantissa;
  int exact_exponent = exact_mantissa.ReadFloatMantissa(parsed_decimal, 768);

  // Adjust the `guess` arguments to be halfway between A and B.
  guess_mantissa = guess_mantissa * 2 + 1;
  guess_exponent -= 1;

  // In our comparison:
  // lhs = exact = exact_mantissa * 10**exact_exponent
  //             = exact_mantissa * 5**exact_exponent * 2**exact_exponent
  // rhs = guess = guess_mantissa * 2**guess_exponent
  //
  // Because we are doing integer math, we can't directly deal with negative
  // exponents.  We instead move these to the other side of the inequality.
  absl::strings_internal::BigUnsigned<84>& lhs = exact_mantissa;
  int comparison;
  if (exact_exponent >= 0) {
    lhs.MultiplyByFiveToTheNth(exact_exponent);
    absl::strings_internal::BigUnsigned<84> rhs(guess_mantissa);
    // There are powers of 2 on both sides of the inequality; reduce this to
    // a single bit-shift.
    if (exact_exponent > guess_exponent) {
      lhs.ShiftLeft(exact_exponent - guess_exponent);
    } else {
      rhs.ShiftLeft(guess_exponent - exact_exponent);
    }
    comparison = Compare(lhs, rhs);
  } else {
    // Move the power of 5 to the other side of the equation, giving us:
    // lhs = exact_mantissa * 2**exact_exponent
    // rhs = guess_mantissa * 5**(-exact_exponent) * 2**guess_exponent
    absl::strings_internal::BigUnsigned<84> rhs =
        absl::strings_internal::BigUnsigned<84>::FiveToTheNth(-exact_exponent);
    rhs.MultiplyBy(guess_mantissa);
    if (exact_exponent > guess_exponent) {
      lhs.ShiftLeft(exact_exponent - guess_exponent);
    } else {
      rhs.ShiftLeft(guess_exponent - exact_exponent);
    }
    comparison = Compare(lhs, rhs);
  }
  if (comparison < 0) {
    return false;
  } else if (comparison > 0) {
    return true;
  } else {
    // When lhs == rhs, the decimal input is exactly between A and B.
    // Round towards even -- round up only if the low bit of the initial
    // `guess_mantissa` was a 1.  We shifted guess_mantissa left 1 bit at
    // the beginning of this function, so test the 2nd bit here.
    return (guess_mantissa & 2) == 2;
  }
}